

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_session_set_local_window_size
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,int32_t window_size)

{
  int iVar1;
  nghttp2_session *session_00;
  int in_ECX;
  int in_EDX;
  undefined1 in_SIL;
  long in_RDI;
  int rv;
  nghttp2_stream *stream;
  int32_t window_size_increment;
  size_t in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  int32_t in_stack_ffffffffffffffd4;
  nghttp2_session *in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar2;
  int local_4;
  
  uVar2 = CONCAT13(in_SIL,in_stack_ffffffffffffffec);
  if (in_ECX < 0) {
    local_4 = -0x1f5;
  }
  else if (in_EDX == 0) {
    iVar1 = in_ECX - *(int *)(in_RDI + 0xb1c);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else if (iVar1 < 0) {
      local_4 = nghttp2_adjust_local_window_size
                          ((int32_t *)((ulong)uVar2 << 0x20),(int32_t *)CONCAT44(in_ECX,iVar1),
                           (int32_t *)in_stack_ffffffffffffffd8,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
      ;
    }
    else {
      local_4 = nghttp2_increase_local_window_size
                          ((int32_t *)((ulong)uVar2 << 0x20),(int32_t *)CONCAT44(in_ECX,iVar1),
                           (int32_t *)in_stack_ffffffffffffffd8,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
      ;
      if (local_4 == 0) {
        if (iVar1 < 1) {
          local_4 = nghttp2_session_update_recv_connection_window_size
                              (in_stack_ffffffffffffffd8,(ulong)in_stack_ffffffffffffffd0);
        }
        else {
          local_4 = nghttp2_session_add_window_update
                              ((nghttp2_session *)CONCAT44(uVar2,in_EDX),
                               (uint8_t)((uint)in_ECX >> 0x18),iVar1,
                               (int32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
        }
      }
    }
  }
  else {
    session_00 = (nghttp2_session *)
                 nghttp2_session_get_stream(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    if (session_00 == (nghttp2_session *)0x0) {
      local_4 = 0;
    }
    else {
      iVar1 = in_ECX - *(int *)((long)&(session_00->root).item + 4);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else if (iVar1 < 0) {
        local_4 = nghttp2_adjust_local_window_size
                            ((int32_t *)CONCAT44(uVar2,in_EDX),(int32_t *)CONCAT44(in_ECX,iVar1),
                             (int32_t *)session_00,
                             (int32_t *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      else {
        local_4 = nghttp2_increase_local_window_size
                            ((int32_t *)CONCAT44(uVar2,in_EDX),(int32_t *)CONCAT44(in_ECX,iVar1),
                             (int32_t *)session_00,
                             (int32_t *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (local_4 == 0) {
          if (iVar1 < 1) {
            local_4 = nghttp2_session_update_recv_stream_window_size
                                (session_00,(nghttp2_stream *)(ulong)in_stack_ffffffffffffffd0,
                                 in_stack_ffffffffffffffc8,0);
          }
          else {
            local_4 = nghttp2_session_add_window_update
                                ((nghttp2_session *)CONCAT44(uVar2,in_EDX),
                                 (uint8_t)((uint)in_ECX >> 0x18),iVar1,
                                 (int32_t)((ulong)session_00 >> 0x20));
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int nghttp2_session_set_local_window_size(nghttp2_session *session,
                                          uint8_t flags, int32_t stream_id,
                                          int32_t window_size) {
  int32_t window_size_increment;
  nghttp2_stream *stream;
  int rv;
  (void)flags;

  if (window_size < 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (stream_id == 0) {
    window_size_increment = window_size - session->local_window_size;

    if (window_size_increment == 0) {
      return 0;
    }

    if (window_size_increment < 0) {
      return nghttp2_adjust_local_window_size(
        &session->local_window_size, &session->recv_window_size,
        &session->recv_reduction, &window_size_increment);
    }

    rv = nghttp2_increase_local_window_size(
      &session->local_window_size, &session->recv_window_size,
      &session->recv_reduction, &window_size_increment);

    if (rv != 0) {
      return rv;
    }

    if (window_size_increment > 0) {
      return nghttp2_session_add_window_update(session, 0, stream_id,
                                               window_size_increment);
    }

    return nghttp2_session_update_recv_connection_window_size(session, 0);
  } else {
    stream = nghttp2_session_get_stream(session, stream_id);

    if (stream == NULL) {
      return 0;
    }

    window_size_increment = window_size - stream->local_window_size;

    if (window_size_increment == 0) {
      return 0;
    }

    if (window_size_increment < 0) {
      return nghttp2_adjust_local_window_size(
        &stream->local_window_size, &stream->recv_window_size,
        &stream->recv_reduction, &window_size_increment);
    }

    rv = nghttp2_increase_local_window_size(
      &stream->local_window_size, &stream->recv_window_size,
      &stream->recv_reduction, &window_size_increment);

    if (rv != 0) {
      return rv;
    }

    if (window_size_increment > 0) {
      return nghttp2_session_add_window_update(session, 0, stream_id,
                                               window_size_increment);
    }

    return nghttp2_session_update_recv_stream_window_size(session, stream, 0,
                                                          1);
  }
}